

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-execution.h
# Opt level: O0

void wasm::LinearExecutionWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
     scan(EquivalentOptimizer *self,Expression **currp)

{
  Expression **ppEVar1;
  bool bVar2;
  Block *pBVar3;
  If *pIVar4;
  Loop *pLVar5;
  Break *pBVar6;
  Switch *pSVar7;
  Return *pRVar8;
  Call *pCVar9;
  CallRef *pCVar10;
  Try *pTVar11;
  TryTable *pTVar12;
  Throw *pTVar13;
  size_t sVar14;
  Expression **ppEVar15;
  BrOn *pBVar16;
  int local_64;
  int i_2;
  ExpressionList *list_2;
  int i_1;
  ExpressionList *list_1;
  Break *br;
  int i;
  ExpressionList *list;
  anon_class_16_2_f793d67d handleCall;
  Expression *curr;
  Expression **currp_local;
  EquivalentOptimizer *self_local;
  
  handleCall.currp = (Expression ***)*currp;
  list = (ExpressionList *)&currp_local;
  handleCall.self = (EquivalentOptimizer **)&curr;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  switch(((Expression *)handleCall.currp)->_id) {
  case InvalidId:
    handle_unreachable("bad id",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                       ,0x62);
  case BlockId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitBlock,
               currp);
    pBVar3 = Expression::cast<wasm::Block>((Expression *)handleCall.currp);
    bVar2 = IString::is(&(pBVar3->name).super_IString);
    if (bVar2) {
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)
                 currp_local,
                 SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                 EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
                 (Expression **)curr);
    }
    pBVar3 = Expression::cast<wasm::Block>((Expression *)handleCall.currp);
    sVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pBVar3->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    br._4_4_ = (int)sVar14;
    while (ppEVar1 = currp_local, br._4_4_ = br._4_4_ + -1, -1 < br._4_4_) {
      ppEVar15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar3->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)br._4_4_);
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
                 scan,ppEVar15);
    }
    break;
  case IfId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitIf,
               currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    ppEVar1 = currp_local;
    pIVar4 = Expression::cast<wasm::If>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::maybePushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pIVar4->ifFalse);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    ppEVar1 = currp_local;
    pIVar4 = Expression::cast<wasm::If>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pIVar4->ifTrue);
    if ((*(byte *)((long)currp_local + 0xd9) & 1) == 0) {
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)
                 currp_local,
                 SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                 EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
                 (Expression **)curr);
    }
    ppEVar1 = currp_local;
    pIVar4 = Expression::cast<wasm::If>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pIVar4->condition);
    break;
  case LoopId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitLoop,
               currp);
    ppEVar1 = currp_local;
    pLVar5 = Expression::cast<wasm::Loop>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pLVar5->body);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    break;
  case BreakId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitBreak,
               currp);
    pBVar6 = Expression::cast<wasm::Break>((Expression *)handleCall.currp);
    if ((pBVar6->condition == (Expression *)0x0) || ((*(byte *)((long)currp_local + 0xd9) & 1) == 0)
       ) {
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)
                 currp_local,
                 SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                 EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
                 (Expression **)curr);
    }
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::maybePushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,scan,&pBVar6->condition);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::maybePushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,scan,&pBVar6->value);
    break;
  case SwitchId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitSwitch
               ,currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    ppEVar1 = currp_local;
    pSVar7 = Expression::cast<wasm::Switch>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pSVar7->condition);
    ppEVar1 = currp_local;
    pSVar7 = Expression::cast<wasm::Switch>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::maybePushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pSVar7->value);
    break;
  case CallId:
    pCVar9 = Expression::cast<wasm::Call>((Expression *)handleCall.currp);
    scan::anon_class_16_2_f793d67d::operator()
              ((anon_class_16_2_f793d67d *)&list,(bool)(pCVar9->isReturn & 1));
    break;
  default:
    bVar2 = Properties::isControlFlowStructure((Expression *)handleCall.currp);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!Properties::isControlFlowStructure(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                    ,0xd1,
                    "static void wasm::LinearExecutionWalker<EquivalentOptimizer>::scan(SubType *, Expression **) [SubType = EquivalentOptimizer, VisitorType = wasm::Visitor<EquivalentOptimizer>]"
                   );
    }
    bVar2 = Properties::isBranch((Expression *)handleCall.currp);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!Properties::isBranch(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                    ,0xd2,
                    "static void wasm::LinearExecutionWalker<EquivalentOptimizer>::scan(SubType *, Expression **) [SubType = EquivalentOptimizer, VisitorType = wasm::Visitor<EquivalentOptimizer>]"
                   );
    }
    PostWalker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::scan
              ((EquivalentOptimizer *)currp_local,(Expression **)curr);
    break;
  case ReturnId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitReturn
               ,currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    ppEVar1 = currp_local;
    pRVar8 = Expression::cast<wasm::Return>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::maybePushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pRVar8->value);
    break;
  case UnreachableId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitUnreachable,currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    break;
  case TryId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitTry,
               currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    pTVar11 = Expression::cast<wasm::Try>((Expression *)handleCall.currp);
    sVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar11->catchBodies).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    list_2._4_4_ = (int)sVar14;
    while (ppEVar1 = currp_local, list_2._4_4_ = list_2._4_4_ + -1, -1 < list_2._4_4_) {
      ppEVar15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar11->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)list_2._4_4_);
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
                 scan,ppEVar15);
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)
                 currp_local,
                 SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                 EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
                 (Expression **)curr);
    }
    pTVar11 = Expression::cast<wasm::Try>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pTVar11->body);
    break;
  case TryTableId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitTryTable,currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    ppEVar1 = currp_local;
    pTVar12 = Expression::cast<wasm::TryTable>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pTVar12->body);
    break;
  case ThrowId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitThrow,
               currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    pTVar13 = Expression::cast<wasm::Throw>((Expression *)handleCall.currp);
    sVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar13->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    local_64 = (int)sVar14;
    while (ppEVar1 = currp_local, local_64 = local_64 + -1, -1 < local_64) {
      ppEVar15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)local_64);
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
                 scan,ppEVar15);
    }
    break;
  case RethrowId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::
               doVisitRethrow,currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)currp_local
               ,SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
               (Expression **)curr);
    break;
  case CallRefId:
    pCVar10 = Expression::cast<wasm::CallRef>((Expression *)handleCall.currp);
    scan::anon_class_16_2_f793d67d::operator()
              ((anon_class_16_2_f793d67d *)&list,(bool)(pCVar10->isReturn & 1));
    break;
  case BrOnId:
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)self,
               Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::doVisitBrOn,
               currp);
    if ((*(byte *)((long)currp_local + 0xd9) & 1) == 0) {
      Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
                ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)
                 currp_local,
                 SimplifyLocals<true,true,true>::runLateOptimizations(wasm::Function*)::
                 EquivalentOptimizer::doNoteNonLinear(EquivalentOptimizer*,wasm::Expression___,
                 (Expression **)curr);
    }
    ppEVar1 = currp_local;
    pBVar16 = Expression::cast<wasm::BrOn>((Expression *)handleCall.currp);
    Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::pushTask
              ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)ppEVar1,
               scan,&pBVar16->ref);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    auto handleCall = [&](bool isReturn) {
      if (!self->connectAdjacentBlocks) {
        // Control is nonlinear if we return, or if EH is enabled or may be.
        if (isReturn || !self->getModule() ||
            self->getModule()->features.hasExceptionHandling()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
      }

      // Scan the children normally.
      PostWalker<SubType, VisitorType>::scan(self, currp);
    };

    switch (curr->_id) {
      case Expression::Id::InvalidId:
        WASM_UNREACHABLE("bad id");
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doVisitBlock, currp);
        if (curr->cast<Block>()->name.is()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        auto& list = curr->cast<Block>()->list;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doVisitIf, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<If>()->ifFalse);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        break;
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doVisitLoop, currp);
        self->pushTask(SubType::scan, &curr->cast<Loop>()->body);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BreakId: {
        self->pushTask(SubType::doVisitBreak, currp);
        auto* br = curr->cast<Break>();
        // If there is no condition then we note non-linearity as the code after
        // us is unreachable anyhow (we do the same for Switch, Return, etc.).
        // If there is a condition, then we note or do not note depending on
        // whether we allow adjacent blocks.
        if (!br->condition || !self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->maybePushTask(SubType::scan, &br->condition);
        self->maybePushTask(SubType::scan, &br->value);
        break;
      }
      case Expression::Id::SwitchId: {
        self->pushTask(SubType::doVisitSwitch, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<Switch>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Switch>()->value);
        break;
      }
      case Expression::Id::ReturnId: {
        self->pushTask(SubType::doVisitReturn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Return>()->value);
        break;
      }
      case Expression::Id::CallId: {
        handleCall(curr->cast<Call>()->isReturn);
        return;
      }
      case Expression::Id::CallRefId: {
        handleCall(curr->cast<CallRef>()->isReturn);
        return;
      }
      case Expression::Id::TryId: {
        self->pushTask(SubType::doVisitTry, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Try>()->catchBodies;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doVisitTryTable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<TryTable>()->body);
        break;
      }
      case Expression::Id::ThrowId: {
        self->pushTask(SubType::doVisitThrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Throw>()->operands;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::RethrowId: {
        self->pushTask(SubType::doVisitRethrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::UnreachableId: {
        self->pushTask(SubType::doVisitUnreachable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BrOnId: {
        self->pushTask(SubType::doVisitBrOn, currp);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<BrOn>()->ref);
        break;
      }
      default: {
        // All relevant things should have been handled.
        assert(!Properties::isControlFlowStructure(curr));
        assert(!Properties::isBranch(curr));
        // other node types do not have control flow, use regular post-order
        PostWalker<SubType, VisitorType>::scan(self, currp);
      }
    }
  }